

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfoManager.cpp
# Opt level: O0

DWORD __thiscall Memory::HeapInfoManager::IdleDecommit(HeapInfoManager *this)

{
  DWORD local_14;
  HeapInfoManager *pHStack_10;
  DWORD waitTime;
  HeapInfoManager *this_local;
  
  local_14 = 0xffffffff;
  pHStack_10 = this;
  ForEachHeapInfo<Memory::HeapInfoManager::IdleDecommit()::__0>
            (this,(anon_class_8_1_f68bbb60)&local_14);
  return local_14;
}

Assistant:

DWORD
HeapInfoManager::IdleDecommit()
{
    DWORD waitTime = INFINITE;
    ForEachHeapInfo([&](HeapInfo& heapInfo)
    {
        DWORD heapInfoWaitTime = heapInfo.IdleDecommit();
        waitTime = min(waitTime, heapInfoWaitTime);
    });
    return waitTime;
}